

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

int Acb_ObjToGia(Gia_Man_t *pNew,Acb_Ntk_t *p,int iObj,Vec_Int_t *vTemp)

{
  int iVar1;
  int iVar2;
  Acb_ObjType_t AVar3;
  int *piVar4;
  int local_48;
  int Res;
  int Type;
  int k;
  int iFanin;
  int *pFanin;
  Vec_Int_t *vTemp_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Acb_ObjIsCio(p,iObj);
  if (iVar1 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                  ,0x2c1,"int Acb_ObjToGia(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *)");
  }
  Vec_IntClear(vTemp);
  Res = 0;
  piVar4 = Acb_ObjFanins(p,iObj);
  for (; Res < *piVar4; Res = Res + 1) {
    iVar1 = piVar4[Res + 1];
    iVar2 = Acb_ObjCopy(p,iVar1);
    if (iVar2 < 0) {
      __assert_fail("Acb_ObjCopy(p, iFanin) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                    ,0x2c5,"int Acb_ObjToGia(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *)");
    }
    iVar1 = Acb_ObjCopy(p,iVar1);
    Vec_IntPush(vTemp,iVar1);
  }
  AVar3 = Acb_ObjType(p,iObj);
  if (AVar3 == ABC_OPER_CONST_F) {
    pNew_local._4_4_ = 0;
  }
  else if (AVar3 == ABC_OPER_CONST_T) {
    pNew_local._4_4_ = 1;
  }
  else if (AVar3 == ABC_OPER_BIT_BUF) {
    pNew_local._4_4_ = Vec_IntEntry(vTemp,0);
  }
  else if (AVar3 == ABC_OPER_BIT_INV) {
    iVar1 = Vec_IntEntry(vTemp,0);
    pNew_local._4_4_ = Abc_LitNot(iVar1);
  }
  else if ((AVar3 == ABC_OPER_BIT_AND) || (AVar3 == ABC_OPER_BIT_NAND)) {
    local_48 = 1;
    for (Res = 0; iVar1 = Vec_IntSize(vTemp), Res < iVar1; Res = Res + 1) {
      iVar1 = Vec_IntEntry(vTemp,Res);
      local_48 = Gia_ManHashAnd(pNew,local_48,iVar1);
    }
    pNew_local._4_4_ = Abc_LitNotCond(local_48,(uint)(AVar3 == ABC_OPER_BIT_NAND));
  }
  else if ((AVar3 == ABC_OPER_BIT_OR) || (AVar3 == ABC_OPER_BIT_NOR)) {
    local_48 = 0;
    for (Res = 0; iVar1 = Vec_IntSize(vTemp), Res < iVar1; Res = Res + 1) {
      iVar1 = Vec_IntEntry(vTemp,Res);
      local_48 = Gia_ManHashOr(pNew,local_48,iVar1);
    }
    pNew_local._4_4_ = Abc_LitNotCond(local_48,(uint)(AVar3 == ABC_OPER_BIT_NOR));
  }
  else {
    if ((AVar3 != ABC_OPER_BIT_XOR) && (AVar3 != ABC_OPER_BIT_NXOR)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                    ,0x2e6,"int Acb_ObjToGia(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *)");
    }
    local_48 = 0;
    for (Res = 0; iVar1 = Vec_IntSize(vTemp), Res < iVar1; Res = Res + 1) {
      iVar1 = Vec_IntEntry(vTemp,Res);
      local_48 = Gia_ManHashXor(pNew,local_48,iVar1);
    }
    pNew_local._4_4_ = Abc_LitNotCond(local_48,(uint)(AVar3 == ABC_OPER_BIT_NXOR));
  }
  return pNew_local._4_4_;
}

Assistant:

int Acb_ObjToGia( Gia_Man_t * pNew, Acb_Ntk_t * p, int iObj, Vec_Int_t * vTemp )
{
    //char * pName = Abc_NamStr( p->pDesign->pStrs, Acb_ObjName(p, iObj) );
    int * pFanin, iFanin, k, Type, Res;
    assert( !Acb_ObjIsCio(p, iObj) );
    Vec_IntClear( vTemp );
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, k )
    {
        assert( Acb_ObjCopy(p, iFanin) >= 0 );
        Vec_IntPush( vTemp, Acb_ObjCopy(p, iFanin) );
    }
    Type = Acb_ObjType( p, iObj );
    if ( Type == ABC_OPER_CONST_F ) 
        return 0;
    if ( Type == ABC_OPER_CONST_T ) 
        return 1;
    if ( Type == ABC_OPER_BIT_BUF ) 
        return Vec_IntEntry(vTemp, 0);
    if ( Type == ABC_OPER_BIT_INV ) 
        return Abc_LitNot( Vec_IntEntry(vTemp, 0) );
    if ( Type == ABC_OPER_BIT_AND || Type == ABC_OPER_BIT_NAND )
    {
        Res = 1;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManHashAnd( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NAND );
    }
    if ( Type == ABC_OPER_BIT_OR || Type == ABC_OPER_BIT_NOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManHashOr( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NOR );
    }
    if ( Type == ABC_OPER_BIT_XOR || Type == ABC_OPER_BIT_NXOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManHashXor( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NXOR );
    }
    assert( 0 );
    return -1;
}